

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.hpp
# Opt level: O2

diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_compilation_cpp:96:37)>
 __thiscall
pstore::diff_details::
traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
::
visit_node<pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_compilation_index(pstore::exchange::export_ns::ostream_base&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
          (traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
           *this,index_pointer node,uint shifts,
          diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_compilation_cpp:96:37)>
          out)

{
  indent ind;
  database *db;
  index_pointer iVar1;
  hash_type hVar2;
  uint128 d;
  bool bVar3;
  uint uVar4;
  address addr;
  ostream_base *poVar5;
  void *__buf;
  void *__buf_00;
  linear_node *__range3_1;
  long lVar6;
  internal_node *__range3;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar7;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 local_78 [32];
  pair<std::shared_ptr<const_void>,_const_pstore::index::details::internal_node_*> p;
  index_pointer node_local;
  
  node_local = node;
  if (((ulong)node.internal_ & 1) == 0) {
    if (((ulong)node.internal_ & 2) != 0) {
      assert_failed("node.is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                    ,0x62);
    }
    bVar3 = traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
            ::is_new((traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                      *)this,node);
    if (bVar3) {
      addr = index::details::index_pointer::to_address((index_pointer *)&node_local.addr_);
      index::
      hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
      ::load_leaf_node((value_type *)&p,
                       ((out.fn_)->compilations->
                       super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr,(out.fn_)->db,addr);
      poVar5 = (ostream_base *)
               exchange::export_ns::ostream_base::write
                         ((out.fn_)->os,(int)*(out.fn_)->sep,__buf,addr.a_);
      exchange::export_ns::operator<<(poVar5,(out.fn_)->ind);
      d.v_._4_4_ = in_stack_ffffffffffffff7c;
      d.v_._0_4_ = in_stack_ffffffffffffff78;
      d.v_._8_8_ = in_stack_ffffffffffffff80;
      exchange::export_ns::emit_digest
                ((export_ns *)(out.fn_)->os,
                 (ostream_base *)
                 p.first.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,d);
      exchange::export_ns::ostream_base::write((out.fn_)->os,0x3a,__buf_00,addr.a_);
      db = (out.fn_)->db;
      poVar5 = (out.fn_)->os;
      ind.distance_ = (out.fn_)->ind->distance_;
      database::getro<pstore::repo::compilation,void>
                ((database *)local_78,(extent<pstore::repo::compilation> *)db);
      exchange::export_ns::emit_compilation
                (poVar5,ind,db,(compilation *)local_78._0_8_,(out.fn_)->strings,*(out.fn_)->comments
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      *(out.fn_)->sep = ",\n";
    }
  }
  else {
    if (shifts < 0x42) {
      index::details::internal_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                  *)local_78,*(database **)this,node);
      p.first.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_78._0_8_;
      p.first.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
      local_78._0_8_ = (element_type *)0x0;
      local_78._8_8_ =
           (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
            )0x0;
      p.second = (internal_node *)local_78._16_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      if ((internal_node *)local_78._16_8_ == (internal_node *)0x0) {
        assert_failed("std::get<Node const *> (p) != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                      ,0x7d);
      }
      uVar4 = index::details::internal_node::size((internal_node *)local_78._16_8_);
      uVar7 = shifts + 6;
      for (lVar6 = 0; (ulong)uVar4 << 3 != lVar6; lVar6 = lVar6 + 8) {
        iVar1 = *(index_pointer *)((long)(local_78._16_8_ + 0x10) + lVar6);
        bVar3 = traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                ::is_new((traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                          *)this,node);
        if (bVar3) {
          out = visit_node<pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_compilation_index(pstore::exchange::export_ns::ostream_base&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
                          (this,iVar1,uVar7,out);
        }
      }
    }
    else {
      index::details::linear_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                  *)local_78,*(database **)this,node);
      p.first.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_78._0_8_;
      p.first.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
      local_78._0_8_ = (element_type *)0x0;
      local_78._8_8_ =
           (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
            )0x0;
      p.second = (internal_node *)local_78._16_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      if ((internal_node *)local_78._16_8_ == (internal_node *)0x0) {
        assert_failed("std::get<Node const *> (p) != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                      ,0x7d);
      }
      hVar2 = *(hash_type *)(local_78._16_8_ + 8);
      uVar7 = shifts + 6;
      for (lVar6 = 0; hVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
        iVar1 = *(index_pointer *)((long)(local_78._16_8_ + 0x10) + lVar6);
        bVar3 = traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                ::is_new((traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                          *)this,node);
        if (bVar3) {
          out = visit_node<pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_compilation_index(pstore::exchange::export_ns::ostream_base&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
                          (this,iVar1,uVar7,out);
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.first.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return (diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_compilation_cpp:96:37)>
          )out.fn_;
}

Assistant:

OutputIterator traverser<Index>::visit_node (index_pointer node, unsigned shifts,
                                                     OutputIterator out) const {
            if (node.is_leaf ()) {
                PSTORE_ASSERT (node.is_address ());
                // If this leaf is not in the "old" byte range then add it to the output
                // collection.
                if (this->is_new (node)) {
                    *out = node.to_address ();
                    ++out;
                }
                return out;
            }

            if (index::details::depth_is_internal_node (shifts)) {
                return this->visit_intermediate<index::details::internal_node> (node, shifts,
                                                                                out);
            }

            return this->visit_intermediate<index::details::linear_node> (node, shifts, out);
        }